

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeopyramid.h
# Opt level: O0

void pzgeom::TPZGeoPyramid::GradX<double>
               (TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZFMatrix<double> *gradx)

{
  double dVar1;
  double *pdVar2;
  long *in_RDX;
  TPZBaseMatrix *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double col;
  int j;
  int i;
  TPZFNMatrix<15,_double> dphi;
  TPZFNMatrix<5,_double> phi;
  int ncol;
  int nrow;
  double in_stack_fffffffffffffda0;
  double in_stack_fffffffffffffda8;
  TPZFNMatrix<15,_double> *in_stack_fffffffffffffdb0;
  int local_204;
  int local_200;
  TPZFMatrix<double> *in_stack_fffffffffffffe70;
  TPZFMatrix<double> *in_stack_fffffffffffffe78;
  TPZVec<double> *in_stack_fffffffffffffe80;
  
  (**(code **)(*in_RDX + 0x68))(in_RDX,3);
  (**(code **)(*in_RDX + 0x78))();
  TPZBaseMatrix::Rows(in_RDI);
  TPZBaseMatrix::Cols(in_RDI);
  TPZFNMatrix<5,_double>::TPZFNMatrix
            ((TPZFNMatrix<5,_double> *)in_stack_fffffffffffffdb0,(int64_t)in_stack_fffffffffffffda8,
             (int64_t)in_stack_fffffffffffffda0);
  TPZFNMatrix<15,_double>::TPZFNMatrix
            (in_stack_fffffffffffffdb0,(int64_t)in_stack_fffffffffffffda8,
             (int64_t)in_stack_fffffffffffffda0);
  pztopology::TPZPyramid::TShape<double>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  for (local_200 = 0; local_200 < 5; local_200 = local_200 + 1) {
    for (local_204 = 0; local_204 < 3; local_204 = local_204 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_204,(long)local_200);
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffdb0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffda8,(int64_t)in_stack_fffffffffffffda0);
      dVar1 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffdb0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffda8,(int64_t)in_stack_fffffffffffffda0);
      *pdVar2 = extraout_XMM0_Qa * dVar1 + *pdVar2;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_204,(long)local_200);
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffdb0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffda8,(int64_t)in_stack_fffffffffffffda0);
      in_stack_fffffffffffffda8 = *pdVar2;
      in_stack_fffffffffffffdb0 =
           (TPZFNMatrix<15,_double> *)
           TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffdb0->super_TPZFMatrix<double>,
                      (int64_t)in_stack_fffffffffffffda8,(int64_t)in_stack_fffffffffffffda0);
      (in_stack_fffffffffffffdb0->super_TPZFMatrix<double>).super_TPZMatrix<double>.
      super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)
           (extraout_XMM0_Qa_00 * in_stack_fffffffffffffda8 +
           (double)(in_stack_fffffffffffffdb0->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                   super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_204,(long)local_200);
      in_stack_fffffffffffffda0 = col;
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffdb0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffda8,(int64_t)col);
      dVar1 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffdb0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffda8,(int64_t)in_stack_fffffffffffffda0);
      *pdVar2 = in_stack_fffffffffffffda0 * dVar1 + *pdVar2;
    }
  }
  TPZFNMatrix<15,_double>::~TPZFNMatrix((TPZFNMatrix<15,_double> *)0x162aec4);
  TPZFNMatrix<5,_double>::~TPZFNMatrix((TPZFNMatrix<5,_double> *)0x162aed1);
  return;
}

Assistant:

inline void TPZGeoPyramid::GradX(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc, TPZFMatrix<T> &gradx){
        
        gradx.Resize(3,3);
        gradx.Zero();
        int nrow = nodes.Rows();
        int ncol = nodes.Cols();
#ifdef PZDEBUG
        if(nrow != 3 || ncol  != 5){
            std::cout << "Objects of incompatible lengths, gradient cannot be computed." << std::endl;
            std::cout << "nodes matrix must be 3x5." << std::endl;
            DebugStop();
        }
        
#endif
        TPZFNMatrix<5,T> phi(5,1);
        TPZFNMatrix<15,T> dphi(3,5);
        TShape(loc,phi,dphi);
        for(int i = 0; i < 5; i++)
        {
            for(int j = 0; j < 3; j++)
            {
                gradx(j,0) += nodes.GetVal(j,i)*dphi(0,i);
                gradx(j,1) += nodes.GetVal(j,i)*dphi(1,i);
                gradx(j,2) += nodes.GetVal(j,i)*dphi(2,i);
            }
        }
        
    }